

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_o3lyp.c
# Opt level: O3

void o3lyp_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar2 = get_ext_param(p,ext_params,0);
  dVar3 = get_ext_param(p,ext_params,1);
  dVar4 = get_ext_param(p,ext_params,2);
  dVar5 = get_ext_param(p,ext_params,3);
  pdVar1 = p->mix_coef;
  *pdVar1 = dVar4 * -1.05151 + dVar3;
  pdVar1[1] = dVar4;
  pdVar1[2] = 1.0 - dVar5;
  pdVar1[3] = dVar5;
  p->cam_alpha = dVar2;
  return;
}

Assistant:

static void
o3lyp_set_ext_params(xc_func_type *p, const double *ext_params)
{
  /* This is the fraction of LDA exchange in OPTX */
  const double a1 = 1.05151;
  double a, b, c, clyp;

  assert(p != NULL);
  a    = get_ext_param(p, ext_params, 0);
  b    = get_ext_param(p, ext_params, 1);
  c    = get_ext_param(p, ext_params, 2);
  clyp = get_ext_param(p, ext_params, 3);

  /* Remove double counting of LDA exchange */
  p->mix_coef[0] = b - a1*c;
  p->mix_coef[1] = c;
  p->mix_coef[2] = 1.0 - clyp;
  p->mix_coef[3] = clyp;

  p->cam_alpha = a;
}